

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.c
# Opt level: O0

ZyanStatus
ZydisEncoderEncodeInstructionInternal
          (ZydisEncoderRequest *request,void *buffer,ZyanUSize *length,
          ZydisEncoderInstruction *instruction)

{
  ZyanStatus status_047620348_2;
  ZyanStatus status_047620348_1;
  ZydisEncoderBuffer output;
  undefined1 local_68 [4];
  ZyanStatus status_047620348;
  ZydisEncoderInstructionMatch match;
  ZydisEncoderInstruction *instruction_local;
  ZyanUSize *length_local;
  void *buffer_local;
  ZydisEncoderRequest *request_local;
  
  match._48_8_ = instruction;
  output.offset._4_4_ =
       ZydisFindMatchingDefinition(request,(ZydisEncoderInstructionMatch *)local_68);
  request_local._4_4_ = output.offset._4_4_;
  if ((output.offset._4_4_ & 0x80000000) == 0) {
    output.buffer = (ZyanU8 *)*length;
    output.size = 0;
    _status_047620348_2 = (ZyanU8 *)buffer;
    request_local._4_4_ =
         ZydisBuildInstruction
                   ((ZydisEncoderInstructionMatch *)local_68,(ZydisEncoderInstruction *)match._48_8_
                   );
    if (((request_local._4_4_ & 0x80000000) == 0) &&
       (request_local._4_4_ =
             ZydisEmitInstruction
                       ((ZydisEncoderInstruction *)match._48_8_,
                        (ZydisEncoderBuffer *)&status_047620348_2),
       (request_local._4_4_ & 0x80000000) == 0)) {
      *length = output.size;
      request_local._4_4_ = 0x100000;
    }
  }
  return request_local._4_4_;
}

Assistant:

static ZyanStatus ZydisEncoderEncodeInstructionInternal(const ZydisEncoderRequest *request,
    void *buffer, ZyanUSize *length, ZydisEncoderInstruction *instruction)
{
    ZydisEncoderInstructionMatch match;
    ZYAN_CHECK(ZydisFindMatchingDefinition(request, &match));
    ZydisEncoderBuffer output;
    output.buffer = (ZyanU8 *)buffer;
    output.size = *length;
    output.offset = 0;
    ZYAN_CHECK(ZydisBuildInstruction(&match, instruction));
    ZYAN_CHECK(ZydisEmitInstruction(instruction, &output));
    *length = output.offset;
    return ZYAN_STATUS_SUCCESS;
}